

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::object_from_column_builder<relive::Station>::operator()
          (object_from_column_builder<relive::Station> *this,
          column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>
          *c)

{
  int iVar1;
  long *plVar2;
  long in_RSI;
  long in_RDI;
  int value;
  sqlite3_stmt *in_stack_ffffffffffffffc8;
  code *pcVar3;
  row_extractor<int,_void> *in_stack_ffffffffffffffd0;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  iVar1 = row_extractor<int,_void>::extract(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  if (*(long *)(in_RSI + 0x20) == -1) {
    pcVar3 = *(code **)(in_RSI + 0x38);
    plVar2 = (long *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RSI + 0x40));
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *plVar2 + -1);
    }
    (*pcVar3)(plVar2,iVar1);
  }
  else {
    *(int *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RSI + 0x20)) = iVar1;
  }
  return;
}

Assistant:

void operator()(const C &c) const {
        using field_type = typename C::field_type;
        auto value = row_extractor<field_type>().extract(this->stmt, this->index++);
        if(c.member_pointer) {
            this->object.*c.member_pointer = std::move(value);
        } else {
            ((this->object).*(c.setter))(std::move(value));
        }
    }